

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_using_recvmmsg(uv_udp_t *handle)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((handle->flags & 0x4000000) != 0) {
    uv_once(&once,uv__udp_mmsg_init);
    uVar1 = (uint)uv__recvmmsg_avail;
  }
  return uVar1;
}

Assistant:

int uv_udp_using_recvmmsg(const uv_udp_t* handle) {
#if HAVE_MMSG
  if (handle->flags & UV_HANDLE_UDP_RECVMMSG) {
    uv_once(&once, uv__udp_mmsg_init);
    return uv__recvmmsg_avail;
  }
#endif
  return 0;
}